

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O3

idx_t duckdb::VectorStringToList::CountPartsList(string_t *input)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  idx_t *piVar4;
  idx_t *piVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  idx_t iVar10;
  optional_idx start_pos;
  idx_t len;
  idx_t end_pos;
  ulong local_70;
  StringCastInputState local_68;
  optional_idx local_48;
  ulong local_40;
  idx_t local_38;
  
  local_40 = (ulong)(input->value).pointer.length;
  if (local_40 < 0xd) {
    pcVar8 = (input->value).pointer.prefix;
  }
  else {
    pcVar8 = (input->value).pointer.ptr;
  }
  local_68.buf = pcVar8;
  local_68.pos = &local_70;
  local_68.len = &local_40;
  local_68.escaped = false;
  uVar7 = 0;
  uVar6 = uVar7;
  if (local_40 != 0) {
    do {
      if ((4 < (byte)pcVar8[uVar6] - 9) && (uVar7 = uVar6, pcVar8[uVar6] != 0x20)) break;
      uVar6 = uVar6 + 1;
      uVar7 = local_40;
    } while (local_40 != uVar6);
    local_68.escaped = false;
  }
  if ((uVar7 == local_40) || (pcVar8[uVar7] != '[')) {
    iVar10 = 0;
  }
  else {
    uVar7 = uVar7 + 1;
    local_70 = uVar7;
    if (uVar7 < local_40) {
      do {
        if ((4 < (byte)pcVar8[local_70] - 9) && (uVar7 = local_70, pcVar8[local_70] != 0x20)) break;
        local_70 = local_70 + 1;
        uVar7 = local_40;
      } while (local_40 != local_70);
      local_68.escaped = false;
    }
    local_68.escaped = false;
    iVar10 = 0;
    piVar4 = &local_40;
    piVar5 = &local_70;
    if (uVar7 < local_40) {
      bVar9 = false;
      do {
        local_48.index = 0xffffffffffffffff;
        while (((local_70 < local_40 && (pcVar8[local_70] != ',')) && (pcVar8[local_70] != ']'))) {
          bVar2 = ValueStateTransition(&local_68,&local_48,&local_38);
          if (!bVar2) {
            return iVar10;
          }
        }
        if (local_70 == local_40) {
          return iVar10;
        }
        cVar3 = pcVar8[local_70];
        if (cVar3 == ']') {
          if (local_48.index != 0xffffffffffffffff) goto LAB_012bfb3d;
          piVar4 = local_68.len;
          piVar5 = local_68.pos;
          uVar7 = local_70;
          if (!bVar9) break;
        }
        else if (local_48.index != 0xffffffffffffffff) {
LAB_012bfb3d:
          optional_idx::GetIndex(&local_48);
          cVar3 = pcVar8[local_70];
        }
        piVar4 = local_68.len;
        piVar5 = local_68.pos;
        pcVar1 = local_68.buf;
        iVar10 = iVar10 + 1;
        uVar7 = local_70;
        if (cVar3 == ']') break;
        local_70 = local_70 + 1;
        uVar7 = *local_68.pos;
        if (uVar7 < *local_68.len) {
          do {
            if ((4 < (byte)pcVar1[uVar7] - 9) && (pcVar1[uVar7] != 0x20)) break;
            uVar7 = uVar7 + 1;
            *piVar5 = uVar7;
            local_68.escaped = false;
          } while (uVar7 < *piVar4);
        }
        bVar9 = true;
        uVar7 = local_70;
      } while (local_70 < local_40);
    }
    local_70 = uVar7 + 1;
    uVar7 = *piVar5;
    if (uVar7 < *piVar4) {
      do {
        if ((4 < (byte)local_68.buf[uVar7] - 9) && (local_68.buf[uVar7] != 0x20)) {
          return iVar10;
        }
        uVar7 = uVar7 + 1;
        *piVar5 = uVar7;
      } while (uVar7 < *piVar4);
    }
  }
  return iVar10;
}

Assistant:

idx_t VectorStringToList::CountPartsList(const string_t &input) {
	CountPartOperation state;
	SplitStringListInternal<CountPartOperation>(input, state);
	return state.count;
}